

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithIntLineWorks_TestShell::
createTest(TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithIntLineWorks_TestShell
           *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x10);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_0037a570;
  return this_00;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, newDeleteOverloadsWithIntLineWorks)
{
    const int line = 42;
    char* leak = new("TestFile.cpp", line) char;

    size_t memLeaks = memLeakDetector->totalMemoryLeaks(mem_leak_period_checking);
    STRCMP_NOCASE_CONTAINS("Allocated at: TestFile.cpp and line: 42.", memLeakDetector->report(mem_leak_period_checking));

    ::operator delete (leak, "TestFile.cpp", line);

    LONGS_EQUAL(memLeaks-1, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
}